

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O1

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::is_exclusive_sequence
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,size_type cur)

{
  pointer prVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  anon_union_4_2_4b30c3bf_for_re_state_0 local_88;
  anon_union_4_2_4b30c3bf_for_re_state_0 aStack_84;
  pointer local_80;
  size_type local_78;
  undefined1 auStack_68 [8];
  range_pairs nextchar_class;
  undefined1 auStack_48 [8];
  range_pairs curchar_class;
  
  prVar1 = (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).NFA_states.buffer_ + cur
  ;
  bVar4 = 0;
  curchar_class.rparray_.size_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  curchar_class.rparray_.buffer_ = (pointer)0x0;
  nextchar_class.rparray_.size_ = 0;
  auStack_68 = (undefined1  [8])0x0;
  nextchar_class.rparray_.buffer_ = (pointer)0x0;
  if (prVar1->type == st_character_class) {
    re_character_class::operator[]
              ((range_pairs *)&local_88,
               &(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class,
               (prVar1->field_0).number);
    auStack_48 = (undefined1  [8])CONCAT44(aStack_84.character,local_88.character);
    curchar_class.rparray_.buffer_ = local_80;
    curchar_class.rparray_.size_ = local_78;
    if (local_80 == (pointer)0x0) {
      bVar4 = 1;
      goto LAB_001bf75c;
    }
  }
  else {
    if (prVar1->type != st_character) goto LAB_001bf75c;
    local_88 = prVar1->field_0;
    aStack_84 = local_88;
    range_pairs::join((range_pairs *)auStack_48,(range_pair *)&local_88);
  }
  bVar2 = gather_nextchars(this,(range_pairs *)auStack_68,cur + 1,0,true);
  if (nextchar_class.rparray_.buffer_ != (pointer)0x0) {
    bVar3 = range_pairs::is_overlap((range_pairs *)auStack_48,(range_pairs *)auStack_68);
    if (!bVar3) {
      bVar4 = !bVar2 | (prVar1->quantifier).field_2.is_greedy;
      goto LAB_001bf75c;
    }
  }
  if (nextchar_class.rparray_.buffer_ == (pointer)0x0) {
    if (bVar2) {
      bVar2 = only_success_left(this,cur + 1);
      if (!bVar2) goto LAB_001bf72e;
    }
    bVar4 = (prVar1->quantifier).field_2.is_greedy;
  }
  else {
LAB_001bf72e:
    bVar4 = 0;
  }
LAB_001bf75c:
  if (auStack_68 != (undefined1  [8])0x0) {
    free((void *)auStack_68);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    free((void *)auStack_48);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool is_exclusive_sequence(const typename state_array::size_type cur) const
	{
		const state_type &curstate = this->NFA_states[cur];
		range_pairs curchar_class;
		range_pairs nextchar_class;

		if (curstate.type == st_character)
		{
			curchar_class.join(range_pair_helper(curstate.character));
		}
		else if (curstate.type == st_character_class)
		{
			curchar_class = this->character_class[curstate.number];
			if (curchar_class.size() == 0)	//  Means [], which always makes matching fail.
				return true;	//  For preventing the automaton from pushing bt data.
		}
		else
		{
			return false;
		}

		const bool canbe0length = gather_nextchars(nextchar_class, cur + 1, 0u, true);

		if (nextchar_class.size() && !curchar_class.is_overlap(nextchar_class))
		{
			return !canbe0length || curstate.quantifier.is_greedy;
		}
		else if (nextchar_class.size() == 0 && (!canbe0length || only_success_left(cur + 1)))
		{
			//  (size() == 0 && !canbe0length) means [].
			return curstate.quantifier.is_greedy;
		}

		return false;
	}